

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_interpolation_17(void)

{
  run("failed context lookups should default to empty strings","I ({{&cannot}}) be seen!","{}",
      (char *)0x0,"I () be seen!");
  return;
}

Assistant:

static void
test_interpolation_17(void)
{
    run(
        "failed context lookups should default to empty strings",
        "I ({{&cannot}}) be seen!",
        "{}",
        NULL,
        "I () be seen!"
    );
}